

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

void __thiscall QProcessEnvironment::insert(QProcessEnvironment *this,QString *name,QString *value)

{
  long lVar1;
  QProcessEnvironmentPrivate *pQVar2;
  iterator this_00;
  QProcessEnvironmentPrivate *in_RDX;
  QMap<QByteArray,_QProcEnvValue> *in_RSI;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffff60;
  QProcEnvValue *in_stack_ffffffffffffff90;
  QSharedDataPointer<QProcessEnvironmentPrivate> *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QSharedDataPointer<QProcessEnvironmentPrivate>::detach(in_stack_ffffffffffffffc0);
  pQVar2 = QSharedDataPointer<QProcessEnvironmentPrivate>::operator->
                     ((QSharedDataPointer<QProcessEnvironmentPrivate> *)in_stack_ffffffffffffff60);
  pQVar2 = (QProcessEnvironmentPrivate *)&pQVar2->vars;
  QSharedDataPointer<QProcessEnvironmentPrivate>::operator->
            ((QSharedDataPointer<QProcessEnvironmentPrivate> *)in_stack_ffffffffffffff60);
  QProcessEnvironmentPrivate::prepareName(in_RDX,(QString *)in_stack_ffffffffffffff90);
  QSharedDataPointer<QProcessEnvironmentPrivate>::operator->
            ((QSharedDataPointer<QProcessEnvironmentPrivate> *)in_stack_ffffffffffffff60);
  QProcessEnvironmentPrivate::prepareValue(pQVar2,in_stack_ffffffffffffff60);
  this_00 = QMap<QByteArray,_QProcEnvValue>::insert
                      (in_RSI,(QByteArray *)in_RDX,in_stack_ffffffffffffff90);
  QProcEnvValue::~QProcEnvValue((QProcEnvValue *)this_00.i._M_node);
  QByteArray::~QByteArray((QByteArray *)0x78e7b2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProcessEnvironment::insert(const QString &name, const QString &value)
{
    // our re-impl of detach() detaches from null
    d.detach(); // detach before prepareName()
    d->vars.insert(d->prepareName(name), d->prepareValue(value));
}